

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<char[6],void*,void*>
          (Capturer *this,size_t index,char (*value) [6],void **values,void **values_1)

{
  string local_50;
  void **local_30;
  void **values_local_1;
  void **values_local;
  char (*value_local) [6];
  size_t index_local;
  Capturer *this_local;
  
  local_30 = values_1;
  values_local_1 = values;
  values_local = (void **)value;
  value_local = (char (*) [6])index;
  index_local = (size_t)this;
  Detail::stringify<char[6]>(&local_50,value);
  captureValue(this,index,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  captureValues<void*,void*>(this,(size_t)(*value_local + 1),values_local_1,local_30);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }